

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O2

void __thiscall adios2::Transport::SetBuffer(Transport *this,char *param_1,size_t param_2)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  invalid_argument local_40 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  std::operator+(&local_30,"ERROR: ",&this->m_Name);
  std::operator+(&local_e0,&local_30," transport type ");
  std::operator+(&local_c0,&local_e0,&this->m_Type);
  std::operator+(&local_a0,&local_c0," using library ");
  std::operator+(&local_80,&local_a0,&this->m_Library);
  std::operator+(&local_60,&local_80," doesn\'t implement the SetBuffer function\n");
  std::invalid_argument::invalid_argument(local_40,(string *)&local_60);
  std::invalid_argument::~invalid_argument(local_40);
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void Transport::SetBuffer(char * /*buffer*/, size_t /*size*/)
{
    std::invalid_argument("ERROR: " + m_Name + " transport type " + m_Type + " using library " +
                          m_Library + " doesn't implement the SetBuffer function\n");
}